

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::readLinearizationData(QPDF *this)

{
  BitStream h;
  BitStream h_00;
  BitStream h_01;
  bool bVar1;
  int iVar2;
  logic_error *this_00;
  pointer pMVar3;
  QPDFExc *pQVar4;
  reference pvVar5;
  size_type sVar6;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_01;
  size_type sVar7;
  longlong lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  uchar *puVar12;
  BitStream local_520;
  undefined1 local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  int local_4a4;
  undefined1 auStack_4a0 [4];
  int HOi;
  size_t sStack_498;
  uchar *local_490;
  size_t sStack_488;
  size_t local_480;
  undefined1 local_472;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  int local_424;
  undefined1 auStack_420 [4];
  int HSi;
  size_t sStack_418;
  uchar *local_410;
  size_t sStack_408;
  size_t local_400;
  size_t local_3f8;
  size_t h_size;
  uchar *h_buf;
  Buffer *hb;
  shared_ptr<Buffer> hbp;
  string local_3c8 [32];
  undefined1 local_3a8 [8];
  QPDFObjectHandle HO;
  string local_390 [32];
  undefined1 local_370 [8];
  QPDFObjectHandle HS;
  undefined1 local_350 [8];
  QPDFObjectHandle H0;
  Pl_Buffer pb;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  int local_2b8;
  int local_2b4;
  int first_page;
  int H1_length;
  int H1_offset;
  int H0_length;
  int H0_offset;
  allocator<char> local_279;
  string local_278;
  int local_254;
  undefined1 local_250 [8];
  QPDFObjectHandle oh;
  size_t i;
  vector<int,_std::allocator<int>_> H_items;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  int local_1cc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  size_t n_H_items;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168 [32];
  undefined1 local_148 [8];
  QPDFObjectHandle P;
  string local_130 [32];
  undefined1 local_110 [8];
  QPDFObjectHandle T;
  string local_f8 [32];
  undefined1 local_d8 [8];
  QPDFObjectHandle N;
  string local_c0 [32];
  undefined1 local_a0 [8];
  QPDFObjectHandle E;
  string local_88 [32];
  undefined1 local_68 [8];
  QPDFObjectHandle O;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle H;
  QPDF *this_local;
  
  bVar1 = isLinearized(this);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"called readLinearizationData for file that is not linearized");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"/H",
             (allocator<char> *)
             ((long)&O.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_30,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&O.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"/O",
             (allocator<char> *)
             ((long)&E.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&E.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"/E",
             (allocator<char> *)
             ((long)&N.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_a0,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&N.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"/N",
             (allocator<char> *)
             ((long)&T.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d8,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&T.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"/T",
             (allocator<char> *)
             ((long)&P.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_110,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&P.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"/P",&local_169);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_148,(string *)&pMVar3->lindict);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_30);
  if (((((!bVar1) || (bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_68), !bVar1)) ||
       (bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_a0), !bVar1)) ||
      ((bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_d8), !bVar1 ||
       (bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_110), !bVar1)))) ||
     ((bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_148), !bVar1 &&
      (bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_148), !bVar1)))) {
    n_H_items._6_1_ = 1;
    pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"linearization dictionary",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"some keys in linearization dictionary are of the wrong type",
               (allocator<char> *)((long)&n_H_items + 7));
    damagedPDF(pQVar4,this,&local_190,&local_1b8);
    n_H_items._6_1_ = 0;
    __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_1cc = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_30);
  local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)toS<int>(&local_1cc);
  if ((local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) &&
     (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4)) {
    H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._6_1_ = 1;
    pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"linearization dictionary",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"H has the wrong number of items",
               (allocator<char> *)
               ((long)&H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    damagedPDF(pQVar4,this,&local_1f0,&local_218);
    H_items.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._6_1_ = 0;
    __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  for (oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi < local_1c8;
      oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(oh.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + 1)) {
    toI<unsigned_long>((unsigned_long *)
                       &oh.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_250,(int)local_30);
    bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_250);
    if (!bVar1) {
      H0_length._2_1_ = 1;
      pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"linearization dictionary",&local_279);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&H0_offset,"some H items are of the wrong type",
                 (allocator<char> *)((long)&H0_length + 3));
      damagedPDF(pQVar4,this,&local_278,(string *)&H0_offset);
      H0_length._2_1_ = 0;
      __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_254 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_250);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&i,&local_254);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_250);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::at((vector<int,_std::allocator<int>_> *)&i,0);
  H1_offset = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at((vector<int,_std::allocator<int>_> *)&i,1);
  H1_length = *pvVar5;
  first_page = 0;
  local_2b4 = 0;
  sVar6 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i);
  if (sVar6 == 4) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::at((vector<int,_std::allocator<int>_> *)&i,2);
    first_page = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::at((vector<int,_std::allocator<int>_> *)&i,3);
    local_2b4 = *pvVar5;
  }
  local_2b8 = 0;
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_148);
  if (bVar1) {
    QTC::TC("qpdf","QPDF P present in lindict",0);
    local_2b8 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_148);
  }
  else {
    QTC::TC("qpdf","QPDF P absent in lindict",0);
  }
  sVar6 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_d8);
  this_01 = getAllPages(this);
  sVar7 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(this_01);
  if (sVar6 == sVar7) {
    iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_68);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).first_page_object = iVar2;
    lVar8 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_a0);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).first_page_end = lVar8;
    iVar2 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_d8);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).npages = iVar2;
    lVar8 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_110);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    iVar2 = local_2b8;
    (pMVar3->linp).xref_zero_offset = lVar8;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).first_page = iVar2;
    lVar9 = (long)H1_offset;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).H_offset = lVar9;
    lVar9 = (long)H1_length;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    (pMVar3->linp).H_length = lVar9;
    Pl_Buffer::Pl_Buffer
              ((Pl_Buffer *)
               &H0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,"hint buffer",(Pipeline *)0x0);
    sVar10 = (size_t)H1_offset;
    toS<int>(&H1_length);
    readHintStream((QPDF *)local_350,(Pipeline *)this,
                   (qpdf_offset_t)
                   &H0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,sVar10);
    if (first_page != 0) {
      sVar10 = (size_t)first_page;
      toS<int>(&local_2b4);
      readHintStream((QPDF *)&HS.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,(Pipeline *)this,
                     (qpdf_offset_t)
                     &H0.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,sVar10)
      ;
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &HS.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_390,"/S",
               (allocator<char> *)
               ((long)&HO.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_370,(string *)local_350);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&HO.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_3c8,"/O",
               (allocator<char> *)
               ((long)&hbp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_3a8,(string *)local_350);
    std::__cxx11::string::~string(local_3c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&hbp.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)&hb);
    h_buf = (uchar *)std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::get
                               ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&hb);
    h_size = (size_t)Buffer::getBuffer((Buffer *)h_buf);
    local_3f8 = Buffer::getSize((Buffer *)h_buf);
    BitStream::BitStream((BitStream *)auStack_420,(uchar *)h_size,local_3f8);
    h.nbytes = sStack_418;
    h.start = _auStack_420;
    h.p = local_410;
    h.bit_offset = sStack_408;
    h.bits_available = local_400;
    readHPageOffset(this,h);
    local_424 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_370);
    if ((-1 < local_424) && (sVar11 = toS<int>(&local_424), sVar10 = local_3f8, sVar11 < local_3f8))
    {
      puVar12 = (uchar *)(h_size + (long)local_424);
      sVar11 = toS<int>(&local_424);
      BitStream::BitStream((BitStream *)auStack_4a0,puVar12,sVar10 - sVar11);
      h_00.nbytes = sStack_498;
      h_00.start = _auStack_4a0;
      h_00.p = local_490;
      h_00.bit_offset = sStack_488;
      h_00.bits_available = local_480;
      readHSharedObject(this,h_00);
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_3a8);
      if (bVar1) {
        local_4a4 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_3a8);
        if ((local_4a4 < 0) ||
           (sVar11 = toS<int>(&local_4a4), sVar10 = local_3f8, local_3f8 <= sVar11)) {
          local_4f2 = 1;
          pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c8,"linearization hint table",&local_4c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f0,"/O (outline) offset is out of bounds",&local_4f1);
          damagedPDF(pQVar4,this,&local_4c8,&local_4f0);
          local_4f2 = 0;
          __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        puVar12 = (uchar *)(h_size + (long)local_4a4);
        sVar11 = toS<int>(&local_4a4);
        BitStream::BitStream(&local_520,puVar12,sVar10 - sVar11);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        h_01.nbytes = local_520.nbytes;
        h_01.start = local_520.start;
        h_01.p = local_520.p;
        h_01.bit_offset = local_520.bit_offset;
        h_01.bits_available = local_520.bits_available;
        readHGeneric(this,h_01,&pMVar3->outline_hints);
      }
      std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&hb);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3a8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_370);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_350);
      Pl_Buffer::~Pl_Buffer
                ((Pl_Buffer *)
                 &H0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_148);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_110);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
      return;
    }
    local_472 = 1;
    pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"linearization hint table",&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"/S (shared object) offset is out of bounds",&local_471);
    damagedPDF(pQVar4,this,&local_448,&local_470);
    local_472 = 0;
    __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pb.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t
  .super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._6_1_ = 1;
  pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"linearization hint table",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"/N does not match number of pages",
             (allocator<char> *)
             ((long)&pb.m._M_t.
                     super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                     .super__Head_base<0UL,_Pl_Buffer::Members_*,_false> + 7));
  damagedPDF(pQVar4,this,&local_2d8,&local_300);
  pb.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t
  .super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
  super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl._6_1_ = 0;
  __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readLinearizationData()
{
    // This function throws an exception (which is trapped by checkLinearization()) for any errors
    // that prevent loading.

    if (!isLinearized()) {
        throw std::logic_error("called readLinearizationData for file that is not linearized");
    }

    // /L is read and stored in linp by isLinearized()
    QPDFObjectHandle H = m->lindict.getKey("/H");
    QPDFObjectHandle O = m->lindict.getKey("/O");
    QPDFObjectHandle E = m->lindict.getKey("/E");
    QPDFObjectHandle N = m->lindict.getKey("/N");
    QPDFObjectHandle T = m->lindict.getKey("/T");
    QPDFObjectHandle P = m->lindict.getKey("/P");

    if (!(H.isArray() && O.isInteger() && E.isInteger() && N.isInteger() && T.isInteger() &&
          (P.isInteger() || P.isNull()))) {
        throw damagedPDF(
            "linearization dictionary",
            "some keys in linearization dictionary are of the wrong type");
    }

    // Hint table array: offset length [ offset length ]
    size_t n_H_items = toS(H.getArrayNItems());
    if (!((n_H_items == 2) || (n_H_items == 4))) {
        throw damagedPDF("linearization dictionary", "H has the wrong number of items");
    }

    std::vector<int> H_items;
    for (size_t i = 0; i < n_H_items; ++i) {
        QPDFObjectHandle oh(H.getArrayItem(toI(i)));
        if (oh.isInteger()) {
            H_items.push_back(oh.getIntValueAsInt());
        } else {
            throw damagedPDF("linearization dictionary", "some H items are of the wrong type");
        }
    }

    // H: hint table offset/length for primary and overflow hint tables
    int H0_offset = H_items.at(0);
    int H0_length = H_items.at(1);
    int H1_offset = 0;
    int H1_length = 0;
    if (H_items.size() == 4) {
        // Acrobat doesn't read or write these (as PDF 1.4), so we don't have a way to generate a
        // test case.
        // QTC::TC("qpdf", "QPDF overflow hint table");
        H1_offset = H_items.at(2);
        H1_length = H_items.at(3);
    }

    // P: first page number
    int first_page = 0;
    if (P.isInteger()) {
        QTC::TC("qpdf", "QPDF P present in lindict");
        first_page = P.getIntValueAsInt();
    } else {
        QTC::TC("qpdf", "QPDF P absent in lindict");
    }

    // Store linearization parameter data

    // Various places in the code use linp.npages, which is initialized from N, to pre-allocate
    // memory, so make sure it's accurate and bail right now if it's not.
    if (N.getIntValue() != static_cast<long long>(getAllPages().size())) {
        throw damagedPDF("linearization hint table", "/N does not match number of pages");
    }

    // file_size initialized by isLinearized()
    m->linp.first_page_object = O.getIntValueAsInt();
    m->linp.first_page_end = E.getIntValue();
    m->linp.npages = N.getIntValueAsInt();
    m->linp.xref_zero_offset = T.getIntValue();
    m->linp.first_page = first_page;
    m->linp.H_offset = H0_offset;
    m->linp.H_length = H0_length;

    // Read hint streams

    Pl_Buffer pb("hint buffer");
    QPDFObjectHandle H0 = readHintStream(pb, H0_offset, toS(H0_length));
    if (H1_offset) {
        (void)readHintStream(pb, H1_offset, toS(H1_length));
    }

    // PDF 1.4 hint tables that we ignore:

    //  /T    thumbnail
    //  /A    thread information
    //  /E    named destination
    //  /V    interactive form
    //  /I    information dictionary
    //  /C    logical structure
    //  /L    page label

    // Individual hint table offsets
    QPDFObjectHandle HS = H0.getKey("/S"); // shared object
    QPDFObjectHandle HO = H0.getKey("/O"); // outline

    auto hbp = pb.getBufferSharedPointer();
    Buffer* hb = hbp.get();
    unsigned char const* h_buf = hb->getBuffer();
    size_t h_size = hb->getSize();

    readHPageOffset(BitStream(h_buf, h_size));

    int HSi = HS.getIntValueAsInt();
    if ((HSi < 0) || (toS(HSi) >= h_size)) {
        throw damagedPDF("linearization hint table", "/S (shared object) offset is out of bounds");
    }
    readHSharedObject(BitStream(h_buf + HSi, h_size - toS(HSi)));

    if (HO.isInteger()) {
        int HOi = HO.getIntValueAsInt();
        if ((HOi < 0) || (toS(HOi) >= h_size)) {
            throw damagedPDF("linearization hint table", "/O (outline) offset is out of bounds");
        }
        readHGeneric(BitStream(h_buf + HOi, h_size - toS(HOi)), m->outline_hints);
    }
}